

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fillpoints.cc
# Opt level: O2

void re2c::scc(dfa_t *dfa,
              stack<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              *stack,vector<unsigned_long,_std::allocator<unsigned_long>_> *lowlink,
              vector<bool,_std::allocator<bool>_> *trivial,size_t i)

{
  size_t *psVar1;
  size_t i_00;
  unsigned_long uVar2;
  undefined8 uVar3;
  pointer puVar4;
  ulong *puVar5;
  _Elt_pointer puVar6;
  ulong uVar7;
  size_t c;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  bool bVar11;
  reference rVar12;
  size_t i_local;
  vector<bool,_std::allocator<bool>_> *local_48;
  size_type local_40;
  size_t local_38;
  
  i_local = i;
  local_48 = trivial;
  local_40 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&stack->c);
  (lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[i] = local_40;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&stack->c,&i_local);
  psVar1 = (dfa->states).
           super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
           super__Vector_impl_data._M_start[i_local]->arcs;
  sVar9 = 0xffffffffffffffff;
  local_38 = 0xffffffffffffffff;
  for (uVar8 = 0; uVar7 = dfa->nchars, uVar8 < uVar7; uVar8 = uVar8 + 1) {
    i_00 = psVar1[uVar8];
    if (i_00 != sVar9) {
      puVar4 = (lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = puVar4[i_00];
      if (uVar7 == 0xfffffffffffffffe) {
        scc(dfa,stack,lowlink,local_48,i_00);
        puVar4 = (lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = puVar4[i_00];
        sVar9 = local_38;
      }
      if (uVar7 < puVar4[i_local]) {
        puVar4[i_local] = uVar7;
      }
    }
  }
  if ((lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[i_local] == local_40) {
    puVar6 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (puVar6 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
      puVar6 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if (i_local == puVar6[-1]) {
      uVar8 = 0xffffffffffffffff;
      do {
        uVar10 = uVar7;
        if (uVar8 - uVar7 == -1) break;
        uVar10 = uVar8 + 1;
        uVar3 = uVar8 + 1;
        uVar8 = uVar10;
      } while (psVar1[uVar3] != i_local);
      bVar11 = uVar7 <= uVar10;
    }
    else {
      bVar11 = false;
    }
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](local_48,i_local);
    puVar5 = rVar12._M_p;
    if (bVar11) {
      uVar8 = rVar12._M_mask | *puVar5;
    }
    else {
      uVar8 = ~rVar12._M_mask & *puVar5;
    }
    *puVar5 = uVar8;
    do {
      puVar6 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar6 == (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar6 = (stack->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      uVar2 = puVar6[-1];
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&stack->c);
      (lowlink->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar2] = 0xffffffffffffffff;
    } while (uVar2 != i_local);
  }
  return;
}

Assistant:

static void scc(
	const dfa_t &dfa,
	std::stack<size_t> &stack,
	std::vector<size_t> &lowlink,
	std::vector<bool> &trivial,
	size_t i)
{
	const size_t link = stack.size();
	lowlink[i] = link;
	stack.push(i);

	const size_t *arcs = dfa.states[i]->arcs;
	for (size_t c = 0; c < dfa.nchars; ++c)
	{
		const size_t j = arcs[c];
		if (j != dfa_t::NIL)
		{
			if (lowlink[j] == UNDEFINED)
			{
				scc(dfa, stack, lowlink, trivial, j);
			}
			if (lowlink[j] < lowlink[i])
			{
				lowlink[i] = lowlink[j];
			}
		}
	}

	if (lowlink[i] == link)
	{
		// SCC is non-trivial (has loops) iff it either:
		//   - consists of multiple nodes (they all must be interconnected)
		//   - consists of single node which loops back to itself
		trivial[i] = i == stack.top()
			&& !loopback(i, dfa.nchars, arcs);

		size_t j;
		do
		{
			j = stack.top();
			stack.pop();
			lowlink[j] = INFINITI;
		}
		while (j != i);
	}
}